

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

double units::readNumericalWords(string *ustring,size_t *index)

{
  double dVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  size_type sVar9;
  long lVar10;
  char *pcVar11;
  double local_98;
  size_t index_sub;
  double local_80;
  string lcstring;
  string local_58;
  double local_38;
  undefined8 uStack_30;
  
  *index = 0;
  if (ustring->_M_string_length < 3) {
    return NAN;
  }
  if ((hasValidNumericalWordStart(std::__cxx11::string_const&)::first_letters_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&hasValidNumericalWordStart(std::__cxx11::string_const&)::
                                   first_letters_abi_cxx11_), iVar4 != 0)) {
    std::__cxx11::string::string
              ((string *)
               hasValidNumericalWordStart(std::__cxx11::string_const&)::first_letters_abi_cxx11_,
               "otfsenhmbtzaOTFSENHMBTZA",(allocator *)&lcstring);
    __cxa_atexit(std::__cxx11::string::~string,
                 hasValidNumericalWordStart(std::__cxx11::string_const&)::first_letters_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&hasValidNumericalWordStart(std::__cxx11::string_const&)::
                         first_letters_abi_cxx11_);
  }
  if ((hasValidNumericalWordStart(std::__cxx11::string_const&)::second_letters_abi_cxx11_ == '\0')
     && (iVar4 = __cxa_guard_acquire(&hasValidNumericalWordStart(std::__cxx11::string_const&)::
                                      second_letters_abi_cxx11_), iVar4 != 0)) {
    std::__cxx11::string::string
              ((string *)
               hasValidNumericalWordStart(std::__cxx11::string_const&)::second_letters_abi_cxx11_,
               "nwhoielurNWHOIELUR",(allocator *)&lcstring);
    __cxa_atexit(std::__cxx11::string::~string,
                 hasValidNumericalWordStart(std::__cxx11::string_const&)::second_letters_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&hasValidNumericalWordStart(std::__cxx11::string_const&)::
                         second_letters_abi_cxx11_);
  }
  lVar6 = std::__cxx11::string::find(-8,(ulong)(uint)(int)*(ustring->_M_dataplus)._M_p);
  if (lVar6 == -1) {
    return NAN;
  }
  lVar6 = std::__cxx11::string::find(' ',(ulong)(uint)(int)(ustring->_M_dataplus)._M_p[1]);
  if (lVar6 == -1) {
    return NAN;
  }
  std::__cxx11::string::string((string *)&lcstring,(string *)ustring);
  sVar3 = lcstring._M_string_length;
  _Var2 = lcstring._M_dataplus;
  for (sVar9 = 0; sVar3 != sVar9; sVar9 = sVar9 + 1) {
    iVar4 = tolower((int)_Var2._M_p[sVar9]);
    _Var2._M_p[sVar9] = (char)iVar4;
  }
  for (lVar6 = 0; lVar6 != 0x90; lVar6 = lVar6 + 0x18) {
    uVar7 = std::__cxx11::string::find((char *)&lcstring,*(ulong *)(&DAT_001b2918 + lVar6));
    if (uVar7 != 0xffffffffffffffff) {
      if (uVar7 == 0) {
        index_sub = 0;
        local_98 = *(double *)((long)&DAT_001b2910 + lVar6);
        iVar4 = *(int *)((long)&groupNumericalWords + lVar6);
        *index = (long)iVar4;
        if ((ulong)(long)iVar4 < lcstring._M_string_length) {
          std::__cxx11::string::substr((ulong)&local_58,(ulong)&lcstring);
          local_80 = readNumericalWords(&local_58,&index_sub);
          std::__cxx11::string::~string((string *)&local_58);
          if (!NAN(local_80)) {
            local_98 = (double)(~-(ulong)(local_80 < local_98) & (ulong)(local_98 * local_80) |
                               (ulong)(local_98 + local_80) & -(ulong)(local_80 < local_98));
            *index = *index + index_sub;
          }
        }
      }
      else {
        index_sub = 0;
        local_80 = *(double *)((long)&DAT_001b2910 + lVar6);
        uVar8 = (long)*(int *)((long)&groupNumericalWords + lVar6) + uVar7;
        *index = uVar8;
        local_38 = 0.0;
        uStack_30 = 0;
        if (uVar8 < lcstring._M_string_length) {
          std::__cxx11::string::substr((ulong)&local_58,(ulong)&lcstring);
          dVar1 = readNumericalWords(&local_58,&index_sub);
          std::__cxx11::string::~string((string *)&local_58);
          if (!NAN(dVar1)) {
            local_38 = (double)(-(ulong)(dVar1 < local_80) & (ulong)dVar1);
            uStack_30 = 0;
            if (local_80 <= dVar1) {
              local_80 = local_80 * dVar1;
            }
            *index = *index + index_sub;
          }
        }
        std::__cxx11::string::substr((ulong)&local_58,(ulong)&lcstring);
        local_98 = readNumericalWords(&local_58,&index_sub);
        std::__cxx11::string::~string((string *)&local_58);
        if ((NAN(local_98)) || (index_sub < uVar7)) {
          *index = index_sub;
        }
        else {
          local_98 = local_38 + local_80 * local_98;
        }
      }
      goto LAB_0016620a;
    }
  }
  iVar4 = std::__cxx11::string::compare((ulong)&lcstring,0,(char *)0x3);
  if (iVar4 == 0) {
    *index = *index + 3;
  }
  lVar6 = 0;
  do {
    lVar10 = lVar6;
    if (lVar10 == 0xc0) {
      lVar6 = -0x10;
      goto LAB_001661b6;
    }
    iVar4 = *(int *)((long)&decadeWords + lVar10);
    iVar5 = std::__cxx11::string::compare((ulong)&lcstring,*index,(char *)(long)iVar4);
    lVar6 = lVar10 + 0x18;
  } while (iVar5 != 0);
  pcVar11 = (char *)(long)iVar4 + *index;
  local_98 = *(double *)((long)&DAT_001b29a0 + lVar10);
  *index = (size_t)pcVar11;
  if (pcVar11 < lcstring._M_string_length) {
    if (lcstring._M_dataplus._M_p[(long)pcVar11] == '-') {
      *index = (size_t)(pcVar11 + 1);
    }
    dVar1 = read1To10(&lcstring,index);
    local_98 = (double)((ulong)local_98 & -(ulong)NAN(dVar1) |
                       ~-(ulong)NAN(dVar1) & (ulong)(local_98 + dVar1));
  }
  goto LAB_0016620a;
  while( true ) {
    iVar4 = *(int *)((long)&PTR_anon_var_dwarf_1124ee_001b2b40 + lVar10);
    iVar5 = std::__cxx11::string::compare((ulong)&lcstring,*index,(char *)(long)iVar4);
    lVar6 = lVar10 + 0x18;
    if (iVar5 == 0) break;
LAB_001661b6:
    lVar10 = lVar6;
    if (lVar10 == 0xf8) goto LAB_001661f3;
  }
  *index = (size_t)((char *)(long)iVar4 + *index);
  local_98 = *(double *)((long)&DAT_001b2b48 + lVar10);
  if (NAN(local_98)) {
LAB_001661f3:
    local_98 = read1To10(&lcstring,index);
  }
LAB_0016620a:
  std::__cxx11::string::~string((string *)&lcstring);
  return local_98;
}

Assistant:

static double readNumericalWords(const std::string& ustring, size_t& index)
{
    double val = constants::invalid_conversion;
    index = 0;
    if (ustring.size() < 3) {
        return val;
    }
    if (!hasValidNumericalWordStart(ustring)) {
        return val;
    }
    std::string lcstring{ustring};
    // make the string lower case for consistency
    std::transform(
        lcstring.begin(), lcstring.end(), lcstring.begin(), ::tolower);
    for (const auto& wp : groupNumericalWords) {
        auto loc = lcstring.find(std::get<0>(wp));
        if (loc != std::string::npos) {
            if (loc == 0) {
                size_t index_sub{0};
                val = std::get<1>(wp);
                index = std::get<2>(wp);
                if (index < lcstring.size()) {
                    double val_p2 =
                        readNumericalWords(lcstring.substr(index), index_sub);
                    if (!std::isnan(val_p2)) {
                        if (val_p2 >= val) {
                            val = val * val_p2;
                        } else {
                            val += val_p2;
                        }

                        index += index_sub;
                    }
                }
                return val;
            }
            size_t index_sub{0};
            val = std::get<1>(wp);
            index = loc + std::get<2>(wp);
            // read the next component
            double val_add{0.0};
            if (index < lcstring.size()) {
                val_add = readNumericalWords(lcstring.substr(index), index_sub);
                if (!std::isnan(val_add)) {
                    if (val_add >= val) {
                        val = val * val_add;
                        val_add = 0.0;
                    }
                    index += index_sub;
                } else {
                    val_add = 0.0;
                }
            }
            // read the previous part
            double val_p2 =
                readNumericalWords(lcstring.substr(0, loc), index_sub);
            if (std::isnan(val_p2) || index_sub < loc) {
                index = index_sub;
                return val_p2;
            }
            val *= val_p2;
            val += val_add;
            return val;
        }
    }
    // clean up "and"
    if (lcstring.compare(0, 3, "and") == 0) {
        index += 3;
    }
    // what we are left with is values below a hundred
    for (const auto& wp : decadeWords) {
        if (lcstring.compare(index, std::get<2>(wp), std::get<0>(wp)) == 0) {
            val = std::get<1>(wp);
            index += std::get<2>(wp);
            if (lcstring.size() > index) {
                if (lcstring[index] == '-') {
                    ++index;
                }
                double toTen = read1To10(lcstring, index);
                if (!std::isnan(toTen)) {
                    val += toTen;
                }
            }
            return val;
        }
    }
    val = readTeens(lcstring, index);
    if (!std::isnan(val)) {
        return val;
    }
    val = read1To10(lcstring, index);
    return val;
}